

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Int_t * Gia_SimAbsFind(Vec_Int_t *vValues,int Value)

{
  int iVar1;
  Vec_Int_t *p;
  undefined4 local_24;
  int Entry;
  int i;
  Vec_Int_t *vSubset;
  int Value_local;
  Vec_Int_t *vValues_local;
  
  p = Vec_IntAlloc(100);
  for (local_24 = 0; iVar1 = Vec_IntSize(vValues), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vValues,local_24);
    if (iVar1 == Value) {
      Vec_IntPush(p,local_24);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_SimAbsFind( Vec_Int_t * vValues, int Value )
{
    Vec_Int_t * vSubset = Vec_IntAlloc( 100 ); int i, Entry;
    Vec_IntForEachEntry( vValues, Entry, i )
        if ( Entry == Value )
            Vec_IntPush( vSubset, i );
    return vSubset;
}